

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O0

double __thiscall BRTS_XZ<UFPC>::Alloc(BRTS_XZ<UFPC> *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  PerformanceEvaluator *perf;
  double dVar4;
  double dVar5;
  double ma_t;
  double t;
  Size local_80;
  Mat_<int> local_78;
  double local_18;
  double ls_t;
  BRTS_XZ<UFPC> *this_local;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  perf = &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_;
  ls_t = (double)this;
  local_18 = UFPC::Alloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) *
                         ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1) + 1,perf);
  PerformanceEvaluator::start(perf);
  cv::MatSize::operator()((MatSize *)&local_80);
  cv::Mat_<int>::Mat_(&local_78,&local_80);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  Data_Compressed::Alloc
            (&this->data_compressed,
             *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8,
             *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset((this->data_compressed).bits,0,
         (long)((this->data_compressed).height * (this->data_compressed).data_width) << 3);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar4 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  Runs::Alloc(&this->data_runs,
              *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8,
              *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  memset((this->data_compressed).bits,0,
         (long)((this->data_compressed).height * (this->data_compressed).data_width) << 3);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar5 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  return local_18 + (dVar4 - dVar5);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(img_.rows, img_.cols);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(img_.rows, img_.cols);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }